

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

void pstore::command_line::
     apply_to_option<pstore::command_line::alias&,char_const(&)[2],pstore::command_line::aliasopt_const&>
               (alias *opt,char (*m0) [2],aliasopt *mods)

{
  name local_40;
  aliasopt *local_20;
  aliasopt *mods_local;
  char (*m0_local) [2];
  alias *opt_local;
  
  local_20 = mods;
  mods_local = (aliasopt *)m0;
  m0_local = (char (*) [2])opt;
  make_modifier(&local_40,*m0);
  name::apply<pstore::command_line::alias>(&local_40,(alias *)m0_local);
  name::~name(&local_40);
  apply_to_option<pstore::command_line::alias&,pstore::command_line::aliasopt_const&>
            ((alias *)m0_local,local_20);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }